

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

ErrorGenerator *
cmCMakePresetsErrors::UNRECOGNIZED_CMAKE_VERSION
          (ErrorGenerator *__return_storage_ptr__,string *version,int current,int required)

{
  anon_class_40_3_c128393c local_48;
  int local_20;
  int local_1c;
  int required_local;
  int current_local;
  string *version_local;
  
  local_20 = required;
  local_1c = current;
  _required_local = version;
  version_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48,(string *)version);
  local_48.current = local_1c;
  local_48.required = local_20;
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<cmCMakePresetsErrors::UNRECOGNIZED_CMAKE_VERSION(std::__cxx11::string_const&,int,int)::__0,void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,&local_48);
  UNRECOGNIZED_CMAKE_VERSION(std::__cxx11::string_const&,int,int)::$_0::~__0((__0 *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

JsonErrors::ErrorGenerator UNRECOGNIZED_CMAKE_VERSION(
  const std::string& version, int current, int required)
{
  return [version, current, required](const Json::Value* value,
                                      cmJSONState* state) -> void {
    state->AddErrorAtValue(cmStrCat("\"cmakeMinimumRequired\" ", version,
                                    " version ", required,
                                    " must be less than ", current),
                           value);
  };
}